

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::Check<unsigned_short,2,true,3u>
          (StorageMultisampleTest *this)

{
  GLushort GVar1;
  ulong uVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  GLushort *pGVar6;
  ulong uVar7;
  allocator_type local_29;
  vector<unsigned_short,_std::allocator<unsigned_short>_> result;
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&result,0x30,&local_29);
  (**(code **)(lVar5 + 0xb8))(0x8c1a,this->m_to_aux);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd46);
  (**(code **)(lVar5 + 0xaa0))
            (0x8c1a,0,0x8227,0x1403,
             result.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glGetTexImage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd4a);
  pGVar6 = Reference::ReferenceData<unsigned_short,_true>::reference;
  uVar2 = 0;
  do {
    uVar7 = uVar2;
    if (uVar7 == 0x30) break;
    GVar1 = *pGVar6;
    pGVar6 = pGVar6 + 1;
    uVar2 = uVar7 + 1;
  } while (result.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7] == GVar1);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  return 0x2f < uVar7;
}

Assistant:

bool StorageMultisampleTest::Check()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching data fro auxiliary texture. */
	std::vector<T> result(TestReferenceDataCount<S, D>());

	gl.bindTexture(InputTextureTarget<D>() /* Auxiliary target is the same as input. */, m_to_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.getTexImage(InputTextureTarget<D>() /* Auxiliary target is the same as input. */, 0, Format<S, N>(), Type<T>(),
				   (glw::GLvoid*)(&result[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexImage has failed");

	/* Comparison. */
	for (glw::GLuint i = 0; i < TestReferenceDataCount<S, D>(); ++i)
	{
		if (!Compare<T>(result[i], ReferenceData<T, N>()[i]))
		{
			return false;
		}
	}

	return true;
}